

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<unsigned_int,void>(ostream_base *this,uint v)

{
  ostream_base *poVar1;
  span<const_char,__1L> s;
  not_null<std::array<char,_10UL>_*> local_38;
  undefined1 local_30 [8];
  pair<const_char_*,_const_char_*> res;
  base10storage<unsigned_int> str;
  uint v_local;
  ostream_base *this_local;
  
  memset((void *)((long)&res.second + 2),0,10);
  gsl::not_null<std::array<char,_10UL>_*>::not_null
            (&local_38,(array<char,_10UL> *)((long)&res.second + 2));
  _local_30 = details::to_characters<unsigned_int,_void>(v,local_38);
  s = gsl::make_span<char_const>((char *)local_30,res.first);
  poVar1 = write<_1l>(this,s);
  return poVar1;
}

Assistant:

ostream_base & write (Unsigned const v) {
                    details::base10storage<Unsigned> str{{}};
                    auto res = details::to_characters (v, &str);
                    return this->write (gsl::make_span (res.first, res.second));
                }